

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool run_simple_msgpack_test(void)

{
  string *__lhs;
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  long lVar4;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  __l;
  allocator<char> local_663;
  allocator<char> local_662;
  allocator<char> local_661;
  allocator<char> local_660;
  allocator<char> local_65f;
  allocator<char> local_65e;
  allocator<char> local_65d;
  allocator<char> local_65c;
  allocator<char> local_65b;
  allocator<char> local_65a;
  boolean_validator local_659;
  form form;
  any var2;
  any var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  sub_form local_5e0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  sub_form local_4b0;
  sub_form local_4a0;
  sub_form local_490;
  sub_form local_480;
  sub_form local_470;
  sub_form local_460;
  sub_form local_450;
  sub_form local_440;
  sub_form local_430;
  anon_struct_64_10_cf75279b form_data;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_3c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_390;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_300;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_2d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_270;
  sub_form local_240;
  string_validator local_230;
  sub_form local_220;
  sub_form local_210;
  sub_form local_200;
  sub_form local_1f0;
  sub_form local_1e0;
  sub_form local_1d0;
  sub_form local_1c0;
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  var._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  var._M_storage._M_ptr = (void *)0x0;
  var2._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  var2._M_storage._M_ptr = (void *)0x0;
  local_4d0._M_dataplus._M_p._0_1_ = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[5],_bool,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
              *)&form_data,(char (*) [5])"bool",(bool *)&local_4d0);
  local_4f0._M_dataplus._M_p._0_1_ = 0xf8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[5],_signed_char,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
              *)&form_data.str.field_2,(char (*) [5])0x139309,(char *)&local_4f0);
  local_510._M_dataplus._M_p._0_1_ = 0xf0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_signed_char,_true>(&local_3c0,(char (*) [6])0x13930f,(char *)&local_510)
  ;
  local_530._M_dataplus._M_p._0_1_ = 0xe0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_signed_char,_true>(&local_390,(char (*) [6])0x139316,(char *)&local_530)
  ;
  local_550._M_dataplus._M_p._0_1_ = 0xc0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_signed_char,_true>(&local_360,(char (*) [6])0x13931d,(char *)&local_550)
  ;
  local_570._M_dataplus._M_p._0_1_ = 8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[6],_unsigned_char,_true>
            (&local_330,(char (*) [6])"uint8",(uchar *)&local_570);
  local_590._M_dataplus._M_p._0_1_ = 0x10;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_unsigned_char,_true>
            (&local_300,(char (*) [7])"uint16",(uchar *)&local_590);
  local_5b0._M_dataplus._M_p._0_1_ = 0x20;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_unsigned_char,_true>
            (&local_2d0,(char (*) [7])"uint32",(uchar *)&local_5b0);
  local_5d0._M_dataplus._M_p._0_1_ = 0x40;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::pair<const_char_(&)[7],_unsigned_char,_true>
            (&local_2a0,(char (*) [7])"uint64",(uchar *)&local_5d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"sting value",(allocator<char> *)&local_430);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_270,(char (*) [7])"string",&local_600);
  __l._M_len = 10;
  __l._M_array = (iterator)&form_data;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         *)&form,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_5e0,(allocator_type *)&local_440);
  std::any::operator=(&var,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                            *)&form);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)&form);
  lVar4 = 0x1b0;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
             *)(&form_data.boolean + lVar4));
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != -0x30);
  std::__cxx11::string::~string((string *)&local_600);
  goodform::msgpack::serialize(&var,local_1a0);
  goodform::msgpack::deserialize((istream *)&ss,&var2);
  goodform::form::form(&form,&var2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"bool",&local_65a);
  local_430 = goodform::sub_form::at(&form.super_sub_form,&local_600);
  local_659 = goodform::sub_form::boolean(&local_430);
  form_data.boolean = goodform::boolean_validator::val(&local_659);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"int8",&local_65b);
  local_440 = goodform::sub_form::at(&form.super_sub_form,&local_4d0);
  goodform::sub_form::int8(&local_5e0);
  form_data.int8 = (int8_t)local_5e0.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"int16",&local_65c);
  local_1c0 = goodform::sub_form::at(&form.super_sub_form,&local_4f0);
  goodform::sub_form::int16(&local_450);
  form_data.int16 = (int16_t)local_450.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"int32",&local_65d);
  local_1d0 = goodform::sub_form::at(&form.super_sub_form,&local_510);
  goodform::sub_form::int32(&local_460);
  form_data.int32 = (int32_t)local_460.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"int64",&local_65e);
  local_1e0 = goodform::sub_form::at(&form.super_sub_form,&local_530);
  goodform::sub_form::int64(&local_470);
  form_data.int64 = (int64_t)local_470.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"uint8",&local_65f);
  local_1f0 = goodform::sub_form::at(&form.super_sub_form,&local_550);
  goodform::sub_form::uint8(&local_480);
  form_data.uint8 = (uint8_t)local_480.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"uint16",&local_660);
  local_200 = goodform::sub_form::at(&form.super_sub_form,&local_570);
  goodform::sub_form::uint16(&local_490);
  form_data.uint16 = (uint16_t)local_490.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"uint32",&local_661);
  local_210 = goodform::sub_form::at(&form.super_sub_form,&local_590);
  goodform::sub_form::uint32(&local_4a0);
  form_data.uint32 = (uint32_t)local_4a0.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"uint64",&local_662);
  local_220 = goodform::sub_form::at(&form.super_sub_form,&local_5b0);
  goodform::sub_form::uint64(&local_4b0);
  form_data.uint64 = (uint64_t)local_4b0.variant_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"string",&local_663);
  local_240 = goodform::sub_form::at(&form.super_sub_form,&local_5d0);
  local_230 = goodform::sub_form::string(&local_240);
  psVar2 = goodform::string_validator::val_abi_cxx11_(&local_230);
  __lhs = &form_data.str;
  std::__cxx11::string::string((string *)__lhs,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_600);
  bVar1 = goodform::form::is_good(&form);
  if ((((((bVar1) && (form_data.boolean == true)) && (form_data.int8 == -8)) &&
       ((form_data.int16 == -0x10 && (form_data.int32 == -0x20)))) &&
      ((form_data.int64 == -0x40 && ((form_data.uint8 == '\b' && (form_data.uint16 == 0x10)))))) &&
     ((form_data.uint32 == 0x20 && (form_data.uint64 == 0x40)))) {
    bVar1 = std::operator!=(__lhs,"sting value");
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Simple MsgPack passed.");
      bVar1 = true;
      std::endl<char,std::char_traits<char>>(poVar3);
      goto LAB_001249d5;
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Simple MsgPack FAILED!");
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar1 = false;
LAB_001249d5:
  std::__cxx11::string::~string((string *)__lhs);
  std::__cxx11::string::~string((string *)&form.error_);
  std::any::reset(&var2);
  std::any::reset(&var);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar1;
}

Assistant:

bool run_simple_msgpack_test()
{
  std::stringstream ss;
  goodform::any var, var2;
  var = goodform::object_t
    {
      {"bool", true},
      {"int8", std::int8_t(-8)},
      {"int16", std::int8_t(-16)},
      {"int32", std::int8_t(-32)},
      {"int64", std::int8_t(-64)},
      {"uint8", std::uint8_t(8)},
      {"uint16", std::uint8_t(16)},
      {"uint32", std::uint8_t(32)},
      {"uint64", std::uint8_t(64)},
      {"string", std::string("sting value")}
    };

  goodform::msgpack::serialize(var, ss);
  goodform::msgpack::deserialize(ss, var2);

  goodform::form form(var2);

  struct
  {
    bool          boolean;
    std::int8_t   int8;
    std::int16_t  int16;
    std::int32_t  int32;
    std::int64_t  int64;
    std::uint8_t  uint8;
    std::uint16_t uint16;
    std::uint32_t uint32;
    std::uint64_t uint64;
    std::string   str;
  } form_data {
    form.at("bool").boolean().val(),
    form.at("int8").int8().val(),
    form.at("int16").int16().val(),
    form.at("int32").int32().val(),
    form.at("int64").int64().val(),
    form.at("uint8").uint8().val(),
    form.at("uint16").uint16().val(),
    form.at("uint32").uint32().val(),
    form.at("uint64").uint64().val(),
    form.at("string").string().val()
  };

  if (!form.is_good())
  {
    std::cerr << "Simple MsgPack FAILED!" << std::endl;
    return false;
  }

  if (!form_data.boolean
    || form_data.int8 != -8
    || form_data.int16 != -16
    || form_data.int32 != -32
    || form_data.int64 != -64
    || form_data.uint8 != 8
    || form_data.uint16 != 16
    || form_data.uint32 != 32
    || form_data.uint64 != 64
    || form_data.str != "sting value")
  {
    std::cerr << "Simple MsgPack FAILED!" << std::endl;
    return false;
  }


  std::cout << "Simple MsgPack passed." << std::endl;
  return true;
}